

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,int64_t i64)

{
  ulong in_RSI;
  ulong *in_RDI;
  
  memset(in_RDI,0,0x10);
  *in_RDI = in_RSI;
  *(undefined2 *)((long)in_RDI + 0xe) = 0x96;
  if ((long)in_RSI < 0) {
    if (-0x80000001 < (long)in_RSI) {
      *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x20;
    }
  }
  else {
    *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x116;
    if ((in_RSI & 0xffffffff00000000) == 0) {
      *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x40;
    }
    if ((in_RSI & 0xffffffff80000000) == 0) {
      *(ushort *)((long)in_RDI + 0xe) = *(ushort *)((long)in_RDI + 0xe) | 0x20;
    }
  }
  return;
}

Assistant:

explicit GenericValue(int64_t i64) RAPIDJSON_NOEXCEPT : data_() {
        data_.n.i64 = i64;
        data_.f.flags = kNumberInt64Flag;
        if (i64 >= 0) {
            data_.f.flags |= kNumberUint64Flag;
            if (!(static_cast<uint64_t>(i64) & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x00000000)))
                data_.f.flags |= kUintFlag;
            if (!(static_cast<uint64_t>(i64) & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
                data_.f.flags |= kIntFlag;
        }
        else if (i64 >= static_cast<int64_t>(RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
            data_.f.flags |= kIntFlag;
    }